

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-cubic.c
# Opt level: O2

void cubic_on_acked(quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,uint64_t largest_acked,
                   uint32_t inflight,int64_t now,uint32_t max_udp_payload_size)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  cubic_float_t t_sec;
  undefined1 auVar4 [16];
  double dVar5;
  double dStack_20;
  
  if (inflight < bytes) {
    __assert_fail("inflight >= bytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/cc-cubic.c"
                  ,0x42,
                  "void cubic_on_acked(quicly_cc_t *, const quicly_loss_t *, uint32_t, uint64_t, uint32_t, int64_t, uint32_t)"
                 );
  }
  if (largest_acked < cc->recovery_end) {
    return;
  }
  uVar3 = cc->cwnd;
  if (uVar3 < cc->ssthresh) {
    uVar3 = uVar3 + bytes;
    cc->cwnd = uVar3;
  }
  else {
    auVar4._0_8_ = (double)(now - (cc->state).cubic.avoidance_start);
    auVar4._8_8_ = (double)(loss->rtt).smoothed;
    auVar4 = divpd(auVar4,_DAT_00129600);
    t_sec = auVar4._0_8_;
    uVar1 = calc_w_cubic(cc,t_sec,max_udp_payload_size);
    dStack_20 = auVar4._8_8_;
    uVar2 = (uint)(long)((double)(cc->state).cubic.w_max * 0.7 +
                        (t_sec / dStack_20) * 0.5294117647058825 * (double)max_udp_payload_size);
    if (uVar1 < uVar2) {
      if (uVar2 <= uVar3) goto LAB_00121c10;
    }
    else {
      uVar1 = calc_w_cubic(cc,dStack_20 + t_sec,max_udp_payload_size);
      dVar5 = (double)uVar3;
      if ((double)uVar1 <= dVar5) goto LAB_00121c10;
      uVar2 = (uint)(long)(((double)uVar1 / dVar5 + -1.0) * (double)max_udp_payload_size + dVar5);
    }
    uVar3 = uVar2;
    cc->cwnd = uVar3;
  }
LAB_00121c10:
  if (cc->cwnd_maximum < uVar3) {
    cc->cwnd_maximum = uVar3;
  }
  return;
}

Assistant:

static void cubic_on_acked(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, uint64_t largest_acked, uint32_t inflight,
                           int64_t now, uint32_t max_udp_payload_size)
{
    assert(inflight >= bytes);
    /* Do not increase congestion window while in recovery. */
    if (largest_acked < cc->recovery_end)
        return;

    /* Slow start. */
    if (cc->cwnd < cc->ssthresh) {
        cc->cwnd += bytes;
        if (cc->cwnd_maximum < cc->cwnd)
            cc->cwnd_maximum = cc->cwnd;
        return;
    }

    /* Congestion avoidance. */
    cubic_float_t t_sec = calc_cubic_t(cc, now);
    cubic_float_t rtt_sec = loss->rtt.smoothed / (cubic_float_t)1000; /* ms -> s */

    uint32_t w_cubic = calc_w_cubic(cc, t_sec, max_udp_payload_size);
    uint32_t w_est = calc_w_est(cc, t_sec, rtt_sec, max_udp_payload_size);

    if (w_cubic < w_est) {
        /* RFC 8312, Section 4.2; TCP-Friendly Region */
        /* Prevent cwnd from shrinking if W_est is reduced due to RTT increase */
        if (w_est > cc->cwnd)
            cc->cwnd = w_est;
    } else {
        /* RFC 8312, Section 4.3/4.4; CUBIC Region */
        cubic_float_t w_cubic_target = calc_w_cubic(cc, t_sec + rtt_sec, max_udp_payload_size);
        /* After fast convergence W_max < W_last_max holds, and hence W_cubic(0) = beta * W_max < beta * W_last_max = cwnd.
         * cwnd could thus shrink without this check (but only after fast convergence). */
        if (w_cubic_target > cc->cwnd)
            /* (W_cubic(t+RTT) - cwnd)/cwnd * MSS = (W_cubic(t+RTT)/cwnd - 1) * MSS */
            cc->cwnd += ((w_cubic_target / cc->cwnd) - 1) * max_udp_payload_size;
    }

    if (cc->cwnd_maximum < cc->cwnd)
        cc->cwnd_maximum = cc->cwnd;
}